

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed>
::operator=(SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed>
            *this,SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed>
                  *RHS)

{
  iterator MinSize;
  iterator pUVar1;
  Unparsed *local_e0;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed>
  *RHS_local;
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed>
  *this_local;
  
  if (this != RHS) {
    MinSize = (iterator)
              (((long)(RHS->
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                      .super_SmallVectorBase.EndX -
               (long)(RHS->
                     super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                     .super_SmallVectorBase.BeginX) / 0x18);
    NewEnd = (iterator)
             (((long)(this->
                     super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                     ).
                     super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                     .super_SmallVectorBase.EndX -
              (long)(this->
                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                    .super_SmallVectorBase.BeginX) / 0x18);
    if (NewEnd < MinSize) {
      pUVar1 = (iterator)
               SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
               ::capacity((SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                           *)this);
      if (pUVar1 < MinSize) {
        SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
        ::destroy_range((Unparsed *)
                        (this->
                        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                        ).
                        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                        .super_SmallVectorBase.BeginX,
                        (Unparsed *)
                        (this->
                        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                        ).
                        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                        .super_SmallVectorBase.EndX);
        SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
        ::setEnd((SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                  *)this,(Unparsed *)
                         (this->
                         super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                         ).
                         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                         .super_SmallVectorBase.BeginX);
        NewEnd = (iterator)0x0;
        SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
        ::grow(&this->
                super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
               ,(size_t)MinSize);
      }
      else if (NewEnd != (iterator)0x0) {
        std::
        copy<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,Fixpp::TagT<17___pe::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>::Unparsed*>
                  ((Unparsed *)
                   (RHS->
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                   ).
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                   .super_SmallVectorBase.BeginX,
                   (Unparsed *)
                   ((long)(RHS->
                          super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                          ).
                          super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                          .super_SmallVectorBase.BeginX + (long)NewEnd * 0x18),
                   (Unparsed *)
                   (this->
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                   ).
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                   .super_SmallVectorBase.BeginX);
      }
      SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,Fixpp::TagT<174u,Fixpp::Type::String>,Fixpp::TagT<175u,Fixpp::Type::String>,Fixpp::TagT<176u,Fixpp::Type::String>,Fixpp::TagT<177u,Fixpp::Type::String>,Fixpp::TagT<178u,Fixpp::Type::String>,Fixpp::TagT<179u,Fixpp::Type::String>,Fixpp::TagT<180u,Fixpp::Type::String>,Fixpp::TagT<181u,Fixpp::Type::String>,Fixpp::TagT<182u,Fixpp::Type::String>,Fixpp::TagT<183u,Fixpp::Type::String>,Fixpp::TagT<184u,Fixpp::Type::String>,Fixpp::TagT<185u,Fixpp::Type::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>::Unparsed,false>
      ::
      uninitialized_copy<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,___pe::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>__Unparsed_>
                ((Unparsed *)
                 ((long)(RHS->
                        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                        ).
                        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                        .super_SmallVectorBase.BeginX + (long)NewEnd * 0x18),
                 (Unparsed *)
                 (RHS->
                 super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                 ).
                 super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                 .super_SmallVectorBase.EndX,
                 (Unparsed *)
                 ((long)(this->
                        super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                        ).
                        super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                        .super_SmallVectorBase.BeginX + (long)NewEnd * 0x18));
      SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
      ::setEnd((SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                *)this,(Unparsed *)
                       ((long)(this->
                              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                              ).
                              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                              .super_SmallVectorBase.BeginX + (long)MinSize * 0x18));
    }
    else {
      if (MinSize == (iterator)0x0) {
        local_e0 = (Unparsed *)
                   (this->
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                   ).
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                   .super_SmallVectorBase.BeginX;
      }
      else {
        local_e0 = std::
                   copy<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,Fixpp::TagT<17___pe::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>::Unparsed*>
                             ((Unparsed *)
                              (RHS->
                              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                              ).
                              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                              .super_SmallVectorBase.BeginX,
                              (Unparsed *)
                              ((long)(RHS->
                                     super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                                     ).
                                     super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                                     .super_SmallVectorBase.BeginX + (long)MinSize * 0x18),
                              (Unparsed *)
                              (this->
                              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                              ).
                              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                              .super_SmallVectorBase.BeginX);
      }
      SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
      ::destroy_range(local_e0,(Unparsed *)
                               (this->
                               super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_false>
                               ).
                               super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                               .super_SmallVectorBase.EndX);
      SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
      ::setEnd((SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>::Unparsed,_void>
                *)this,local_e0);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}